

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

Presence flatbuffers::FieldDef::MakeFieldPresence(bool optional,bool required)

{
  Presence local_10;
  byte local_b;
  bool required_local;
  bool optional_local;
  
  local_b = 0;
  if (required) {
    local_b = optional;
  }
  if (((local_b ^ 0xff) & 1) != 0) {
    if (required) {
      local_10 = kRequired;
    }
    else {
      local_10 = kDefault;
      if (optional) {
        local_10 = kOptional;
      }
    }
    return local_10;
  }
  __assert_fail("!(required && optional)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                ,0x178,"static Presence flatbuffers::FieldDef::MakeFieldPresence(bool, bool)");
}

Assistant:

Presence static MakeFieldPresence(bool optional, bool required) {
    FLATBUFFERS_ASSERT(!(required && optional));
    // clang-format off
    return required ? FieldDef::kRequired
         : optional ? FieldDef::kOptional
                    : FieldDef::kDefault;
    // clang-format on
  }